

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.h
# Opt level: O1

void __thiscall Js::InlinedFrameWalker::~InlinedFrameWalker(InlinedFrameWalker *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->parentFunction != (ScriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptStackWalker.h"
                                ,0x5d,"(!parentFunction)","!parentFunction");
    if (!bVar2) goto LAB_00763047;
    *puVar3 = 0;
  }
  if (this->frames != (InlinedFrame **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptStackWalker.h"
                                ,0x5e,"(!this->frames)","!this->frames");
    if (!bVar2) goto LAB_00763047;
    *puVar3 = 0;
  }
  if (this->frameCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptStackWalker.h"
                                ,0x5f,"(!frameCount)","!frameCount");
    if (!bVar2) goto LAB_00763047;
    *puVar3 = 0;
  }
  if (this->currentIndex != -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptStackWalker.h"
                                ,0x60,"(currentIndex == -1)","currentIndex == -1");
    if (!bVar2) {
LAB_00763047:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

~InlinedFrameWalker()
        {
            Assert(!parentFunction);
            Assert(!this->frames);
            Assert(!frameCount);
            Assert(currentIndex == -1);
        }